

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O0

Amap_Lib_t * Amap_ParseTokens(Vec_Ptr_t *vTokens,int fVerbose)

{
  int iVar1;
  uint uVar2;
  Amap_Lib_t *p_00;
  Amap_Gat_t *pAVar3;
  char *pcVar4;
  Amap_Pin_t *pAVar5;
  double dVar6;
  uint local_60;
  int local_5c;
  int Count;
  int iPos;
  int nPins;
  int i;
  char *pMoGate;
  char *pToken;
  Amap_Pin_t *pPin;
  Amap_Gat_t *pPrev;
  Amap_Gat_t *pGate;
  Amap_Lib_t *p;
  int fVerbose_local;
  Vec_Ptr_t *vTokens_local;
  
  _nPins = 0.0;
  local_60 = 0;
  p_00 = Amap_LibAlloc();
  pMoGate = (char *)Vec_PtrEntry(vTokens,0);
  local_5c = 1;
  do {
    iVar1 = strcmp(pMoGate,"GATE");
    if (iVar1 != 0) {
      Amap_LibFree(p_00);
      printf("The first line should begin with %s.\n","GATE");
      return (Amap_Lib_t *)0x0;
    }
    iVar1 = Amap_ParseCountPins(vTokens,local_5c);
    pAVar3 = Amap_ParseGateAlloc(p_00->pMemGates,iVar1);
    memset(pAVar3,0,0x40);
    uVar2 = Vec_PtrSize(p_00->vGates);
    *(uint *)&pAVar3->field_0x38 = *(uint *)&pAVar3->field_0x38 & 0xff800000 | uVar2 & 0x7fffff;
    Vec_PtrPush(p_00->vGates,pAVar3);
    pAVar3->pLib = p_00;
    *(uint *)&pAVar3->field_0x38 = *(uint *)&pAVar3->field_0x38 & 0xffffff | iVar1 << 0x18;
    pcVar4 = (char *)Vec_PtrEntry(vTokens,local_5c);
    pcVar4 = Amap_ParseStrsav(p_00->pMemGates,pcVar4);
    pAVar3->pName = pcVar4;
    pcVar4 = (char *)Vec_PtrEntry(vTokens,local_5c + 1);
    dVar6 = atof(pcVar4);
    pAVar3->dArea = dVar6;
    pcVar4 = (char *)Vec_PtrEntry(vTokens,local_5c + 2);
    pcVar4 = Amap_ParseStrsav(p_00->pMemGates,pcVar4);
    pAVar3->pOutName = pcVar4;
    pcVar4 = (char *)Vec_PtrEntry(vTokens,local_5c + 3);
    local_5c = Amap_CollectFormulaTokens(vTokens,pcVar4,local_5c + 4);
    pcVar4 = Amap_ParseStrsav(p_00->pMemGates,pcVar4);
    pAVar3->pForm = pcVar4;
    for (pToken = (char *)(pAVar3 + 1);
        pToken < (char *)((long)pAVar3 +
                         (long)(int)(*(uint *)&pAVar3->field_0x38 >> 0x18) * 0x48 + 0x40);
        pToken = pToken + 0x48) {
      pcVar4 = (char *)Vec_PtrEntry(vTokens,local_5c);
      iVar1 = strcmp(pcVar4,"PIN");
      if (iVar1 != 0) {
        Amap_LibFree(p_00);
        printf("Cannot parse gate %s.\n",pAVar3->pName);
        return (Amap_Lib_t *)0x0;
      }
      pcVar4 = (char *)Vec_PtrEntry(vTokens,local_5c + 1);
      pcVar4 = Amap_ParseStrsav(p_00->pMemGates,pcVar4);
      *(char **)pToken = pcVar4;
      pcVar4 = (char *)Vec_PtrEntry(vTokens,local_5c + 2);
      iVar1 = strcmp(pcVar4,"UNKNOWN");
      if (iVar1 == 0) {
        pToken[8] = '\0';
        pToken[9] = '\0';
        pToken[10] = '\0';
        pToken[0xb] = '\0';
      }
      else {
        iVar1 = strcmp(pcVar4,"INV");
        if (iVar1 == 0) {
          pToken[8] = '\x01';
          pToken[9] = '\0';
          pToken[10] = '\0';
          pToken[0xb] = '\0';
        }
        else {
          iVar1 = strcmp(pcVar4,"NONINV");
          if (iVar1 != 0) {
            Amap_LibFree(p_00);
            printf("Cannot read phase of pin %s of gate %s\n",*(undefined8 *)pToken,pAVar3->pName);
            return (Amap_Lib_t *)0x0;
          }
          pToken[8] = '\x02';
          pToken[9] = '\0';
          pToken[10] = '\0';
          pToken[0xb] = '\0';
        }
      }
      pcVar4 = (char *)Vec_PtrEntry(vTokens,local_5c + 3);
      dVar6 = atof(pcVar4);
      *(double *)(pToken + 0x10) = dVar6;
      pcVar4 = (char *)Vec_PtrEntry(vTokens,local_5c + 4);
      dVar6 = atof(pcVar4);
      *(double *)(pToken + 0x18) = dVar6;
      pcVar4 = (char *)Vec_PtrEntry(vTokens,local_5c + 5);
      dVar6 = atof(pcVar4);
      *(double *)(pToken + 0x20) = dVar6;
      pcVar4 = (char *)Vec_PtrEntry(vTokens,local_5c + 6);
      dVar6 = atof(pcVar4);
      *(double *)(pToken + 0x28) = dVar6;
      iVar1 = local_5c + 8;
      pcVar4 = (char *)Vec_PtrEntry(vTokens,local_5c + 7);
      dVar6 = atof(pcVar4);
      *(double *)(pToken + 0x30) = dVar6;
      local_5c = local_5c + 9;
      pcVar4 = (char *)Vec_PtrEntry(vTokens,iVar1);
      dVar6 = atof(pcVar4);
      *(double *)(pToken + 0x38) = dVar6;
      if (*(double *)(pToken + 0x20) < *(double *)(pToken + 0x30) ||
          *(double *)(pToken + 0x20) == *(double *)(pToken + 0x30)) {
        *(undefined8 *)(pToken + 0x40) = *(undefined8 *)(pToken + 0x30);
      }
      else {
        *(undefined8 *)(pToken + 0x40) = *(undefined8 *)(pToken + 0x20);
      }
    }
    if ((*(uint *)&pAVar3->field_0x38 >> 0x18 == 1) &&
       (iVar1 = strcmp((char *)pAVar3[1].pLib,"*"), iVar1 == 0)) {
      pAVar3 = Amap_ParseGateWithSamePins(pAVar3);
      Vec_PtrPop(p_00->vGates);
      Vec_PtrPush(p_00->vGates,pAVar3);
    }
    pMoGate = (char *)Vec_PtrEntry(vTokens,local_5c);
    iVar1 = strcmp(pMoGate,".end");
    local_5c = local_5c + 1;
  } while (iVar1 != 0);
  pPin = (Amap_Pin_t *)0x0;
  for (iPos = 0; iVar1 = Vec_PtrSize(p_00->vGates), iPos < iVar1; iPos = iPos + 1) {
    pAVar5 = (Amap_Pin_t *)Vec_PtrEntry(p_00->vGates,iPos);
    if ((pPin != (Amap_Pin_t *)0x0) &&
       (iVar1 = strcmp((char *)pPin->dLoadInput,(char *)pAVar5->dLoadInput), iVar1 == 0)) {
      *(Amap_Pin_t **)&pPin->Phase = pAVar5;
      *(Amap_Pin_t **)&pAVar5->Phase = pPin;
      if (_nPins == 0.0) {
        _nPins = pAVar5->dLoadInput;
      }
      local_60 = local_60 + 1;
    }
    pPin = pAVar5;
  }
  if (local_60 != 0) {
    printf("Warning: Detected %d multi-output gates (for example, \"%s\").\n",(ulong)local_60,_nPins
          );
  }
  return p_00;
}

Assistant:

Amap_Lib_t * Amap_ParseTokens( Vec_Ptr_t * vTokens, int fVerbose )
{
    Amap_Lib_t * p;
    Amap_Gat_t * pGate, * pPrev;
    Amap_Pin_t * pPin;
    char * pToken, * pMoGate = NULL;
    int i, nPins, iPos = 0, Count = 0;
    p = Amap_LibAlloc();
    pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
    do 
    {
        if ( strcmp( pToken, AMAP_STRING_GATE ) )
        {
            Amap_LibFree( p );
            printf( "The first line should begin with %s.\n", AMAP_STRING_GATE );
            return NULL;
        }
        // start gate
        nPins = Amap_ParseCountPins( vTokens, iPos );
        pGate = Amap_ParseGateAlloc( p->pMemGates, nPins );
        memset( pGate, 0, sizeof(Amap_Gat_t) );
        pGate->Id = Vec_PtrSize( p->vGates );
        Vec_PtrPush( p->vGates, pGate );
        pGate->pLib = p;
        pGate->nPins = nPins;
        // read gate
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
        pGate->pName = Amap_ParseStrsav( p->pMemGates, pToken );    
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
        pGate->dArea = atof( pToken );
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
        pGate->pOutName = Amap_ParseStrsav( p->pMemGates, pToken ); 
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
        iPos = Amap_CollectFormulaTokens( vTokens, pToken, iPos );
        pGate->pForm = Amap_ParseStrsav( p->pMemGates, pToken ); 
        // read pins
        Amap_GateForEachPin( pGate, pPin )
        {
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            if ( strcmp( pToken, AMAP_STRING_PIN ) )
            {
                Amap_LibFree( p );
                printf( "Cannot parse gate %s.\n", pGate->pName );
                return NULL;
            }
            // read pin
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->pName = Amap_ParseStrsav( p->pMemGates, pToken );   
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            if ( strcmp( pToken, AMAP_STRING_UNKNOWN ) == 0 )
                pPin->Phase = AMAP_PHASE_UNKNOWN;
            else if ( strcmp( pToken, AMAP_STRING_INV ) == 0 )
                pPin->Phase = AMAP_PHASE_INV;
            else if ( strcmp( pToken, AMAP_STRING_NONINV ) == 0 )
                pPin->Phase = AMAP_PHASE_NONINV;
            else 
            {
                Amap_LibFree( p );
                printf( "Cannot read phase of pin %s of gate %s\n", pPin->pName, pGate->pName );
                return NULL;
            }
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dLoadInput = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dLoadMax = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dDelayBlockRise = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dDelayFanoutRise = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dDelayBlockFall = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dDelayFanoutFall = atof( pToken );
            if ( pPin->dDelayBlockRise > pPin->dDelayBlockFall )
                pPin->dDelayBlockMax = pPin->dDelayBlockRise;
            else
                pPin->dDelayBlockMax = pPin->dDelayBlockFall;
        }
        // fix the situation when all pins are represented as one
        if ( pGate->nPins == 1 && !strcmp( pGate->Pins->pName, "*" ) )
        {
            pGate = Amap_ParseGateWithSamePins( pGate );
            Vec_PtrPop( p->vGates );
            Vec_PtrPush( p->vGates, pGate );
        }
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
//printf( "Finished reading gate %s (%s)\n", pGate->pName, pGate->pOutName );
    }
    while ( strcmp( pToken, ".end" ) );

    // check if there are gates with identical names
    pPrev = NULL;
    Amap_LibForEachGate( p, pGate, i )
    {
        if ( pPrev && !strcmp(pPrev->pName, pGate->pName) )
        {
            pPrev->pTwin = pGate, pGate->pTwin = pPrev;
//            printf( "Warning: Detected multi-output gate \"%s\".\n", pGate->pName );
            if ( pMoGate == NULL )
                pMoGate = pGate->pName;
            Count++;
        }
        pPrev = pGate;
    }
    if ( Count )
        printf( "Warning: Detected %d multi-output gates (for example, \"%s\").\n", Count, pMoGate );
    return p;
}